

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M2Data.cpp
# Opt level: O3

bool __thiscall M2Data::parse_file_name(M2Data *this,char *monthly_csv_file_name)

{
  byte *pbVar1;
  char *pcVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  size_t sVar6;
  size_t sVar7;
  bool bVar8;
  byte bVar9;
  M2DataType MVar10;
  int iVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  int iVar17;
  char **ppcVar18;
  
  sVar6 = strlen(monthly_csv_file_name);
  if (sVar6 < 4) {
    iVar3 = 0;
    iVar11 = 0;
    uVar13 = 0;
    iVar17 = 0;
    uVar14 = 0;
    uVar16 = 0;
  }
  else {
    ppcVar18 = file_suffix;
    lVar12 = 0;
    do {
      pcVar2 = *ppcVar18;
      sVar7 = strlen(pcVar2);
      if ((sVar7 < sVar6) &&
         (iVar3 = strcmp(monthly_csv_file_name + (sVar6 - sVar7),pcVar2), iVar3 == 0)) {
        MVar10 = *(M2DataType *)((long)file_type + lVar12);
        this->M2Type = MVar10;
        goto LAB_0016f7dc;
      }
      lVar12 = lVar12 + 4;
      ppcVar18 = ppcVar18 + 1;
    } while (lVar12 != 0xc);
    MVar10 = this->M2Type;
    sVar7 = 0;
LAB_0016f7dc:
    iVar3 = (int)sVar7;
    if (MVar10 == UnknownM2Type) {
      iVar11 = 0;
      uVar13 = 0;
      iVar17 = 0;
      uVar14 = 0;
      uVar16 = 0;
    }
    else {
      uVar14 = 1;
      iVar11 = 0;
      uVar15 = 0;
      do {
        uVar16 = uVar15;
        uVar15 = uVar16 + 1;
        iVar17 = ((byte)monthly_csv_file_name[uVar16] - 0x30) + iVar11 * 10;
        if ((byte)(monthly_csv_file_name[uVar16] - 0x3aU) < 0xf6) {
          uVar14 = 0;
          iVar17 = iVar11;
        }
        iVar11 = iVar17;
      } while ((uVar14 != 0) && ((uint)uVar16 < 3));
      uVar13 = 0;
      if (iVar11 - 0x80aU < 0xffffffd7) {
        uVar14 = uVar13;
      }
      if ((uVar14 != 0) &&
         (pcVar2 = monthly_csv_file_name + uVar15, uVar15 = uVar16 + 2, *pcVar2 != '-')) {
        uVar14 = 0;
      }
      if (uVar14 == 0) {
        iVar17 = 0;
        uVar16 = uVar15;
      }
      else if (MVar10 == TLD_old) {
        iVar17 = 1;
        ppcVar18 = month_names;
        lVar12 = 0;
        do {
          pcVar2 = *ppcVar18;
          sVar7 = strlen(pcVar2);
          uVar16 = sVar7 + uVar15;
          if ((uVar16 < sVar6) &&
             (iVar4 = strncmp(monthly_csv_file_name + uVar15,pcVar2,sVar7), iVar4 == 0)) {
            uVar13 = *(uint *)((long)month_day + lVar12);
            goto LAB_0016f9d3;
          }
          lVar12 = lVar12 + 4;
          iVar17 = iVar17 + 1;
          ppcVar18 = ppcVar18 + 1;
        } while (lVar12 != 0x30);
        uVar13 = 0;
        iVar17 = 0;
        uVar14 = 0;
        uVar16 = uVar15;
      }
      else {
        bVar8 = true;
        iVar17 = 0;
        do {
          uVar16 = uVar15;
          uVar15 = uVar16 + 1;
          iVar4 = ((byte)monthly_csv_file_name[uVar16] - 0x30) + iVar17 * 10;
          if ((byte)(monthly_csv_file_name[uVar16] - 0x3aU) < 0xf6) {
            uVar14 = 0;
            iVar4 = iVar17;
          }
          iVar17 = iVar4;
        } while ((bVar8) && (bVar8 = false, uVar14 != 0));
        uVar13 = 0;
        if (iVar17 - 0xdU < 0xfffffff4) {
          uVar14 = 0;
        }
        if (uVar14 != 0) {
          pcVar2 = monthly_csv_file_name + uVar15;
          uVar15 = uVar16 + 2;
          if (*pcVar2 != '-') {
            uVar14 = 0;
          }
        }
        bVar9 = (byte)uVar14;
        if (uVar14 != 0) {
          bVar8 = true;
          uVar13 = 0;
          do {
            pbVar1 = (byte *)(monthly_csv_file_name + uVar15);
            uVar15 = uVar15 + 1;
            uVar5 = (*pbVar1 - 0x30) + uVar13 * 10;
            if ((byte)(*pbVar1 - 0x3a) < 0xf6) {
              uVar14 = 0;
              uVar5 = uVar13;
            }
            uVar13 = uVar5;
            bVar9 = (byte)uVar14;
          } while ((bVar8) && (bVar8 = false, uVar14 != 0));
        }
        uVar14 = (uint)bVar9;
        uVar16 = uVar15;
        if (uVar13 - 0x20 < 0xffffffe1) {
          uVar14 = 0;
        }
      }
    }
  }
LAB_0016f9d3:
  uVar5 = 0;
  if ((long)iVar3 + uVar16 == sVar6) {
    uVar5 = uVar14;
  }
  if (uVar14 == 0) {
    uVar5 = uVar14;
  }
  if (uVar5 != 0) {
    this->year = iVar11;
    this->month = iVar17;
    this->day = uVar13;
  }
  return SUB41(uVar5,0);
}

Assistant:

bool M2Data::parse_file_name(char const * monthly_csv_file_name)
{
    bool ret = true;
    size_t len = strlen(monthly_csv_file_name);
    size_t char_index = 0;
    int y = 0;
    int m = 0;
    int d = 0;
    int suffix_len = 0;

    if (len < 4)
    {
        ret = false;
    }
    else
    {
        for (int i = 0; i < 3; i++)
        {
            size_t sl = strlen(file_suffix[i]);
            if (sl < len && strcmp(monthly_csv_file_name + len - sl, file_suffix[i]) == 0)
            {
                M2Type = file_type[i];
                suffix_len = (int) sl;
                break;
            }
        }

        if (M2Type == UnknownM2Type)
        {
            ret = false;
        }

        for (int i = 0; ret && i < 4; i++)
        {
            char c = monthly_csv_file_name[char_index++];

            if (c < '0' || c > '9')
            {
                ret = false;
            }
            else
            {
                y *= 10;
                y += c - '0';
            }
        }

        if (y < 2017 || y > 2057)
        {
            ret = false;
        }
    }

    if (ret && monthly_csv_file_name[char_index++] != '-')
    {
        ret = false;
    }

    if (ret)
    {
        if (M2Type == TLD_old)
        {
            for (int i = 0; i < 12; i++)
            {
                size_t ml = strlen(month_names[i]);
                if ((char_index + ml) < len &&
                    strncmp(&monthly_csv_file_name[char_index], month_names[i], ml) == 0)
                {
                    m = i+1;
                    char_index += ml;
                    break;
                }
            }


            if (m <= 0)
            {
                ret = false;
            }
            else
            {
                d = month_day[m-1];
            }
        }
        else
        {
            for (int i = 0; ret && i < 2; i++)
            {
                char c = monthly_csv_file_name[char_index++];

                if (c < '0' || c > '9')
                {
                    ret = false;
                }
                else
                {
                    m *= 10;
                    m += c - '0';
                }
            }

            if (m <= 0 || m > 12)
            {
                ret = false;
            }

            if (ret && monthly_csv_file_name[char_index++] != '-')
            {
                ret = false;
            }

            for (int i = 0; ret && i < 2; i++)
            {
                char c = monthly_csv_file_name[char_index++];

                if (c < '0' || c > '9')
                {
                    ret = false;
                }
                else
                {
                    d *= 10;
                    d += c - '0';
                }
            }

            if (d <= 0 || d > 31)
            {
                ret = false;
            }
        }
    }

    if (ret && char_index+suffix_len != len)
    {
        ret = false;
    }

    if (ret)
    {
        year = y;
        month = m;
        day = d;
    }

    return ret;
}